

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

Index * findIndexOrPrimaryKey(sqlite3 *db,char *zName,char *zDb)

{
  Index *pIVar1;
  Table *pTVar2;
  
  pIVar1 = sqlite3FindIndex(db,zName,zDb);
  if (pIVar1 == (Index *)0x0) {
    pTVar2 = sqlite3FindTable(db,zName,zDb);
    if ((pTVar2 != (Table *)0x0) && ((pTVar2->tabFlags & 0x20) != 0)) {
      for (pIVar1 = pTVar2->pIndex; pIVar1 != (Index *)0x0; pIVar1 = pIVar1->pNext) {
        if ((*(ushort *)&pIVar1->field_0x63 & 3) == 2) {
          return pIVar1;
        }
      }
    }
    pIVar1 = (Index *)0x0;
  }
  return pIVar1;
}

Assistant:

static Index *findIndexOrPrimaryKey(
  sqlite3 *db,
  const char *zName,
  const char *zDb
){
  Index *pIdx = sqlite3FindIndex(db, zName, zDb);
  if( pIdx==0 ){
    Table *pTab = sqlite3FindTable(db, zName, zDb);
    if( pTab && !HasRowid(pTab) ) pIdx = sqlite3PrimaryKeyIndex(pTab);
  }
  return pIdx;
}